

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O0

void testTiledRgba(string *tempDir)

{
  byte bVar1;
  string *tempDir_00;
  ostream *poVar2;
  void *pvVar3;
  exception *e;
  int comp;
  int i;
  int H [4];
  int W [4];
  int n;
  int maxThreads;
  string *in_stack_00000280;
  string *in_stack_00000840;
  int in_stack_ffffffffffffff8c;
  ostream *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int W_00;
  int local_50;
  int local_4c;
  int local_48 [11];
  int local_1c;
  int local_18;
  
  tempDir_00 = (string *)
               std::operator<<((ostream *)&std::cout,"Testing the tiled RGBA image interface");
  std::ostream::operator<<(tempDir_00,std::endl<char,std::char_traits<char>>);
  bVar1 = IlmThread_3_4::supportsThreads();
  W_00 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
  local_18 = 0;
  if ((bVar1 & 1) != 0) {
    local_18 = 3;
  }
  for (local_1c = 0; local_1c <= local_18; local_1c = local_1c + 1) {
    bVar1 = IlmThread_3_4::supportsThreads();
    W_00 = CONCAT13((char)((uint)W_00 >> 0x18),CONCAT12(bVar1,(short)W_00));
    if ((bVar1 & 1) != 0) {
      Imf_3_4::setGlobalThreadCount(local_1c);
      in_stack_ffffffffffffff90 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      in_stack_ffffffffffffff8c = Imf_3_4::globalThreadCount();
      pvVar3 = (void *)std::ostream::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c)
      ;
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    local_48[4] = 9;
    local_48[5] = 0x45;
    local_48[6] = 0x4b;
    local_48[7] = 0x50;
    local_48[0] = 7;
    local_48[1] = 0x32;
    local_48[2] = 0x34;
    local_48[3] = 0x37;
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\nImage size = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_48[(long)local_4c + 4]);
      poVar2 = std::operator<<(poVar2," x ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,local_48[local_4c]);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      for (local_50 = 0; local_50 < 10; local_50 = local_50 + 1) {
        if (local_50 == 3) {
          local_50 = 4;
        }
        if (local_4c == 0) {
          anon_unknown.dwarf_24c551::writeRead
                    (tempDir_00,W_00,in_stack_ffffffffffffff98,
                     (Compression)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
        anon_unknown.dwarf_24c551::writeRead
                  (tempDir_00,W_00,in_stack_ffffffffffffff98,
                   (Compression)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        anon_unknown.dwarf_24c551::writeRead
                  (tempDir_00,W_00,in_stack_ffffffffffffff98,
                   (Compression)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        anon_unknown.dwarf_24c551::writeRead
                  (tempDir_00,W_00,in_stack_ffffffffffffff98,
                   (Compression)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
    }
    anon_unknown.dwarf_24c551::writeReadIncomplete(in_stack_00000280);
  }
  anon_unknown.dwarf_24c551::writeReadLayers(in_stack_00000840);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testTiledRgba (const std::string& tempDir)
{
    try
    {
        cout << "Testing the tiled RGBA image interface" << endl;

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            const int W[] = {9, 69, 75, 80};
            const int H[] = {7, 50, 52, 55};

            for (int i = 0; i < 4; ++i)
            {
                cout << "\nImage size = " << W[i] << " x " << H[i] << endl;

                for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
                {
                    //
                    // for tiled files, ZIPS and ZIP are the same thing
                    //

                    if (comp == ZIP_COMPRESSION) comp++;

                    if (i == 0)
                    {
                        //
                        // for single-pixel tiles, we don't gain anything
                        // by testing multiple image sizes (and singe-pixel
                        // tiles are rather slow anyway)
                        //

                        writeRead (
                            tempDir, W[i], H[i], Compression (comp), 1, 1);
                    }

                    writeRead (tempDir, W[i], H[i], Compression (comp), 35, 26);
                    writeRead (tempDir, W[i], H[i], Compression (comp), 75, 52);
                    writeRead (
                        tempDir, W[i], H[i], Compression (comp), 264, 129);
                }
            }

            writeReadIncomplete (tempDir);
        }

        writeReadLayers (tempDir);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}